

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# db.c
# Opt level: O1

void reset_room(ROOM_INDEX_DATA *pRoom)

{
  byte *pbVar1;
  undefined2 uVar2;
  EXIT_DATA *pEVar3;
  bool bVar4;
  bool bVar5;
  int iVar6;
  char cVar7;
  int iVar8;
  uint uVar9;
  OBJ_INDEX_DATA *pOVar10;
  OBJ_INDEX_DATA *pOVar11;
  obj_data *poVar12;
  ROOM_INDEX_DATA *pRVar13;
  MOB_INDEX_DATA *pMobIndex;
  ROOM_INDEX_DATA *pRVar14;
  CHAR_DATA *pCVar15;
  short *args;
  char *pcVar16;
  short sVar17;
  char_data *pcVar18;
  int iVar19;
  ulong uVar20;
  size_t sVar21;
  long lVar22;
  RESET_DATA *pRVar23;
  OBJ_DATA *pOVar24;
  long lVar25;
  string_view fmt;
  string_view fmt_00;
  string_view fmt_01;
  string_view fmt_02;
  string_view fmt_03;
  string_view fmt_04;
  char_data *local_50;
  OBJ_DATA *local_48;
  
  if (pRoom != (ROOM_INDEX_DATA *)0x0) {
    if (pRoom->trap != (TRAP_DATA *)0x0) {
      pRoom->trap->armed = true;
    }
    pRVar23 = pRoom->reset_first;
    if (pRVar23 != (RESET_DATA *)0x0) {
      bVar5 = true;
      iVar6 = 0;
      local_50 = (char_data *)0x0;
      do {
        switch(pRVar23->command) {
        case 'D':
          pRVar13 = get_room_index(0);
          if (pRVar13 == (ROOM_INDEX_DATA *)0x0) {
            args = &pRVar23->arg1;
            sVar21 = 0x1d;
            pcVar16 = "Reset_area: \'D\': bad vnum {}.";
            goto LAB_0012e5d9;
          }
          pEVar3 = pRVar13->exit[pRVar23->arg2];
          if (pEVar3 != (EXIT_DATA *)0x0) {
            uVar20 = pEVar3->exit_info[0];
            pEVar3->exit_info[0] = uVar20 | 1;
            sVar17 = pRVar23->arg3;
            bVar5 = true;
            if (sVar17 == 2) {
              uVar20 = uVar20 | 7;
            }
            else {
              if (sVar17 != 1) {
                if (sVar17 == 0) {
                  pEVar3->exit_info[0] = uVar20 & 0xfffffffffffffff9 | 1;
                }
                break;
              }
              uVar20 = uVar20 & 0xfffffffffffffff8 | 3;
            }
            pEVar3->exit_info[0] = uVar20;
          }
          break;
        case 'E':
        case 'G':
          args = &pRVar23->arg1;
          pOVar10 = get_obj_index(0);
          if (pOVar10 == (OBJ_INDEX_DATA *)0x0) {
            sVar21 = 0x24;
            pcVar16 = "Reset_room: \'E\' or \'G\': bad vnum {}.";
            goto LAB_0012e5d9;
          }
          if (!bVar5) break;
          if (local_50 == (char_data *)0x0) {
            fmt_03._M_str = "Reset_room: \'E\' or \'G\': null mob for vnum {}.";
            fmt_03._M_len = 0x2d;
            CLogger::Warn<short&>((CLogger *)std::runtime_error::runtime_error,fmt_03,args);
            local_50 = (CHAR_DATA *)0x0;
            goto LAB_0012e5bf;
          }
          if (local_50->pIndexData->pShop == (SHOP_DATA *)0x0) {
            sVar17 = pOVar10->limtotal;
            bVar4 = sVar17 <= pOVar10->limcount;
            if (0 >= sVar17 || !bVar4) {
              uVar20 = number_mm();
              if (((uint)uVar20 & 3) == 3) {
                iVar8 = iVar6 + 1;
              }
              else {
                iVar8 = iVar6;
                if ((uVar20 & 3) == 0) {
                  iVar8 = iVar6 + -1;
                }
              }
              if (iVar8 < 2) {
                iVar8 = 1;
              }
              if (0x31 < iVar8) {
                iVar8 = 0x32;
              }
              local_48 = create_object(pOVar10,iVar8);
              pcVar16 = (char *)palloc_string("none");
              local_48->owner = pcVar16;
            }
            if (0 < sVar17 && bVar4) break;
            goto LAB_0012e85c;
          }
          iVar8 = 0;
          if (pOVar10->new_format != false) goto switchD_0012dfe7_caseD_6;
          iVar8 = 0;
          switch(pOVar10->item_type) {
          case 2:
          case 10:
switchD_0012dfe7_caseD_2:
            iVar19 = 0x35;
            lVar25 = 1;
            do {
              if (0 < (long)pOVar10->value[lVar25]) {
                lVar22 = 4;
                do {
                  if (*(short *)(&skill_table + lVar22 * 2 + (long)pOVar10->value[lVar25] * 0x60) <=
                      iVar19) {
                    iVar19 = (int)*(short *)(&skill_table +
                                            lVar22 * 2 + (long)pOVar10->value[lVar25] * 0x60);
                  }
                  lVar22 = lVar22 + 1;
                } while (lVar22 != 0x10);
              }
              lVar25 = lVar25 + 1;
            } while (lVar25 != 5);
            iVar8 = iVar19 * 3 + 3;
            if (-1 < iVar19 * 3) {
              iVar8 = iVar19 * 3;
            }
            iVar8 = iVar8 >> 2;
            if (iVar8 < 3) {
              iVar8 = 2;
            }
            iVar8 = iVar8 + -2;
            break;
          case 3:
            do {
              lVar25 = number_mm();
              uVar9 = (uint)lVar25 & 0xf;
            } while (10 < uVar9);
            goto LAB_0012e421;
          case 4:
            do {
              lVar25 = number_mm();
              uVar9 = (uint)lVar25 & 0xf;
            } while (10 < uVar9);
            iVar8 = uVar9 + 0xf;
            break;
          case 5:
            do {
              lVar25 = number_mm();
              uVar9 = (uint)lVar25 & 0xf;
            } while (10 < uVar9);
            goto LAB_0012e40c;
          case 6:
          case 7:
            break;
          case 8:
            do {
              lVar25 = number_mm();
              uVar9 = (uint)lVar25 & 0xf;
            } while (10 < uVar9);
LAB_0012e421:
            iVar8 = uVar9 + 10;
            break;
          case 9:
            do {
              lVar25 = number_mm();
              uVar9 = (uint)lVar25 & 0xf;
            } while (10 < uVar9);
LAB_0012e40c:
            iVar8 = uVar9 + 5;
            break;
          default:
            if (pOVar10->item_type == 0x1a) goto switchD_0012dfe7_caseD_2;
          }
switchD_0012dfe7_caseD_6:
          local_48 = create_object(pOVar10,iVar8);
          pcVar16 = (char *)palloc_string("none");
          local_48->owner = pcVar16;
          if (local_48->pIndexData->limtotal == 0) {
            pbVar1 = (byte *)((long)local_48->extra_flags + 1);
            *pbVar1 = *pbVar1 | 0x20;
          }
LAB_0012e85c:
          obj_to_char(local_48,local_50);
          bVar5 = true;
          if (pRVar23->command == 'E') {
            sVar17 = pRVar23->arg3;
            if (sVar17 == 0x12) {
              lVar25 = get_eq_char(local_50,0x10);
              if (lVar25 == 0) {
LAB_0012e90c:
                iVar8 = 0x10;
              }
              else {
                iVar8 = (int)pRVar23->arg3;
              }
            }
            else if (sVar17 == 0x10) {
              poVar12 = (obj_data *)get_eq_char(local_50,0x10);
              if (poVar12 != (obj_data *)0x0) {
                unequip_char(local_50,poVar12,true);
                equip_char(local_50,poVar12,0x12,true);
                goto LAB_0012e90c;
              }
              iVar8 = (int)pRVar23->arg3;
            }
            else {
              iVar8 = (int)sVar17;
            }
            equip_char(local_50,local_48,iVar8,true);
          }
          break;
        case 'F':
          if (local_50 == (char_data *)0x0) {
            local_50 = (CHAR_DATA *)0x0;
          }
          else {
            pcVar18 = local_50->in_room->people;
            while ((pcVar18 != (char_data *)0x0 &&
                   ((cVar7 = is_npc(pcVar18), cVar7 == '\0' ||
                    (pRVar23->arg2 != pcVar18->pIndexData->vnum))))) {
              pcVar18 = pcVar18->next_in_room;
            }
            if ((bVar5) && (pcVar18 != (char_data *)0x0)) {
              add_follower(local_50,pcVar18);
              local_50->leader = pcVar18;
            }
          }
          break;
        default:
          fmt._M_str = "Reset_area: bad command {}.";
          fmt._M_len = 0x1b;
          CLogger::Warn<char&>((CLogger *)std::runtime_error::runtime_error,fmt,&pRVar23->command);
          break;
        case 'M':
          pMobIndex = get_mob_index(0);
          if (pMobIndex == (MOB_INDEX_DATA *)0x0) {
            args = &pRVar23->arg1;
            sVar21 = 0x1d;
            pcVar16 = "Reset_area: \'M\': bad vnum {}.";
          }
          else {
            pRVar13 = get_room_index(0);
            if (pRVar13 != (ROOM_INDEX_DATA *)0x0) {
              iVar8 = 0;
              if (pRVar23->arg2 <= pMobIndex->count) goto LAB_0012e5bf;
              pCVar15 = pRVar13->people;
              if (pCVar15 != (CHAR_DATA *)0x0) {
                iVar8 = 0;
                do {
                  if ((pCVar15->pIndexData == pMobIndex) &&
                     (iVar8 = iVar8 + 1, pRVar23->arg4 <= iVar8)) {
                    bVar5 = false;
                    break;
                  }
                  pCVar15 = pCVar15->next_in_room;
                } while (pCVar15 != (CHAR_DATA *)0x0);
              }
              if (iVar8 < pRVar23->arg4) {
                local_50 = create_mobile(pMobIndex);
                cVar7 = room_is_dark(pRoom);
                if (cVar7 != '\0') {
                  pbVar1 = (byte *)((long)local_50->affected_by + 1);
                  *pbVar1 = *pbVar1 | 2;
                }
                pRVar14 = get_room_index(0);
                if ((pRVar14 != (ROOM_INDEX_DATA *)0x0) && ((pRVar14->room_flags[0] & 0x1000) != 0))
                {
                  pbVar1 = (byte *)((long)local_50->act + 1);
                  *pbVar1 = *pbVar1 | 1;
                }
                local_50->zone = pRVar13->area;
                char_to_room(local_50,pRoom);
                sVar17 = local_50->level;
                bVar5 = true;
                iVar6 = 0;
                if (1 < sVar17) {
                  iVar6 = sVar17 + -2;
                  if (0x34 < sVar17) {
                    iVar6 = 0x32;
                  }
                }
              }
              break;
            }
            args = &pRVar23->arg3;
            sVar21 = 0x1d;
            pcVar16 = "Reset_area: \'R\': bad vnum {}.";
          }
          goto LAB_0012e5d9;
        case 'O':
          pOVar10 = get_obj_index(0);
          if (pOVar10 == (OBJ_INDEX_DATA *)0x0) {
            fmt_00._M_str = "Reset_room: \'O\' 1 : bad vnum {}";
            fmt_00._M_len = 0x1f;
            CLogger::Warn<short&>
                      ((CLogger *)std::runtime_error::runtime_error,fmt_00,&pRVar23->arg1);
          }
          else {
            pRVar13 = get_room_index(0);
            if (pRVar13 != (ROOM_INDEX_DATA *)0x0) {
              for (pOVar24 = pRVar13->contents; pOVar24 != (obj_data *)0x0;
                  pOVar24 = pOVar24->next_content) {
                if (((pOVar24->pIndexData->vnum == pOVar10->vnum) &&
                    (cVar7 = is_obj_stat(pOVar24,0x21), cVar7 == '\0')) &&
                   (((cVar7 = is_obj_stat(pOVar24,0x18), cVar7 == '\0' &&
                     ((cVar7 = is_obj_stat(pOVar24,0x17), cVar7 == '\0' &&
                      (pOVar24->item_type == 0xf)))) && (pOVar24->contains == (OBJ_DATA *)0x0)))) {
                  extract_obj(pOVar24);
                }
              }
              if ((pOVar10->limtotal <= pOVar10->limcount && 0 < pOVar10->limtotal) ||
                 (iVar8 = count_obj_list(pOVar10,pRVar13->contents), 0 < iVar8)) goto LAB_0012e5bf;
              uVar20 = number_mm();
              if (((uint)uVar20 & 3) == 3) {
                iVar8 = iVar6 + 1;
              }
              else {
                iVar8 = iVar6;
                if ((uVar20 & 3) == 0) {
                  iVar8 = iVar6 + -1;
                }
              }
              if (iVar8 < 2) {
                iVar8 = 1;
              }
              if (0x31 < iVar8) {
                iVar8 = 0x32;
              }
              local_48 = create_object(pOVar10,iVar8);
              local_48->cost = 0;
              pcVar16 = (char *)palloc_string("none");
              local_48->owner = pcVar16;
              pcVar16 = (char *)palloc_string("someone a long long time ago");
              local_48->talked = pcVar16;
              obj_to_room(local_48,pRoom);
LAB_0012e76b:
              bVar5 = true;
              break;
            }
            fmt_01._M_str = "Reset_room: \'O\' 2 : bad vnum {}.";
            fmt_01._M_len = 0x20;
            CLogger::Warn<short&>
                      ((CLogger *)std::runtime_error::runtime_error,fmt_01,&pRVar23->arg3);
          }
          fmt_02._M_str = "{} {} {} {}";
          fmt_02._M_len = 0xb;
          CLogger::Warn<short&,short&,short&,short&>
                    ((CLogger *)std::runtime_error::runtime_error,fmt_02,&pRVar23->arg1,
                     &pRVar23->arg2,&pRVar23->arg3,&pRVar23->arg4);
          break;
        case 'P':
          pOVar10 = get_obj_index(0);
          if (pOVar10 == (OBJ_INDEX_DATA *)0x0) {
            args = &pRVar23->arg1;
          }
          else {
            pOVar11 = get_obj_index(0);
            if (pOVar11 != (OBJ_INDEX_DATA *)0x0) {
              uVar2 = pRVar23->arg2;
              sVar17 = uVar2;
              if (uVar2 == -1) {
                sVar17 = 999;
              }
              if (0x32 < (short)uVar2) {
                sVar17 = 6;
              }
              if ((((pRoom->area->nplayer < 2) &&
                   (poVar12 = (obj_data *)get_obj_type(pOVar11), poVar12 != (obj_data *)0x0)) &&
                  ((poVar12->in_room != (ROOM_INDEX_DATA *)0x0 || (bVar5)))) &&
                 ((((pOVar10->limtotal < 1 || (pOVar10->limcount < pOVar10->limtotal)) &&
                   (pOVar10->count < sVar17)) &&
                  (iVar8 = count_obj_list(pOVar10,poVar12->contains), iVar8 <= pRVar23->arg4)))) {
                for (; iVar8 < pRVar23->arg4; iVar8 = iVar8 + 1) {
                  iVar19 = (int)poVar12->level;
                  uVar20 = number_mm();
                  if (((uint)uVar20 & 3) == 3) {
                    iVar19 = iVar19 + 1;
                  }
                  else if ((uVar20 & 3) == 0) {
                    iVar19 = iVar19 + -1;
                  }
                  if (iVar19 < 2) {
                    iVar19 = 1;
                  }
                  local_48 = create_object(pOVar10,iVar19);
                  pcVar16 = (char *)palloc_string("none");
                  local_48->owner = pcVar16;
                  obj_to_obj(local_48,poVar12);
                  if (0 < pOVar10->limtotal && pOVar10->limtotal <= pOVar10->limcount) break;
                }
                poVar12->value[1] = poVar12->pIndexData->value[1];
                goto LAB_0012e76b;
              }
LAB_0012e5bf:
              bVar5 = false;
              break;
            }
            args = &pRVar23->arg3;
          }
          sVar21 = 0x1d;
          pcVar16 = "Reset_room: \'P\': bad vnum {}.";
LAB_0012e5d9:
          fmt_04._M_str = pcVar16;
          fmt_04._M_len = sVar21;
          CLogger::Warn<short&>((CLogger *)std::runtime_error::runtime_error,fmt_04,args);
          break;
        case 'R':
          pRVar13 = get_room_index(0);
          if (pRVar13 == (ROOM_INDEX_DATA *)0x0) {
            args = &pRVar23->arg1;
            sVar21 = 0x1d;
            pcVar16 = "Reset_room: \'R\': bad vnum {}.";
            goto LAB_0012e5d9;
          }
          if (1 < pRVar23->arg2) {
            uVar20 = (ulong)((int)pRVar23->arg2 - 1);
            lVar25 = 0;
            do {
              iVar8 = number_range((int)lVar25,(int)uVar20);
              pEVar3 = pRVar13->exit[lVar25];
              pRVar13->exit[lVar25] = pRVar13->exit[iVar8];
              pRVar13->exit[iVar8] = pEVar3;
              lVar25 = lVar25 + 1;
              uVar20 = (long)pRVar23->arg2 - 1;
            } while (lVar25 < (long)uVar20);
          }
        }
        pRVar23 = pRVar23->next;
      } while (pRVar23 != (RESET_DATA *)0x0);
    }
  }
  return;
}

Assistant:

void reset_room(ROOM_INDEX_DATA *pRoom)
{
	RESET_DATA *pReset;
	CHAR_DATA *pMob;
	CHAR_DATA *mob;
	OBJ_DATA *pObj, *pObj2;
	CHAR_DATA *LastMob = nullptr;
	OBJ_DATA *LastObj = nullptr;
	EXIT_DATA *pexit = nullptr;
	bool last;
	int level = 0;
	char buf[MSL];
	CHAR_DATA *rch;
	bool found;

	if (!pRoom)
		return;

	pMob = nullptr;
	last = true;

	if (pRoom->trap)
		pRoom->trap->armed = true;

	for (pReset = pRoom->reset_first; pReset != nullptr; pReset = pReset->next)
	{
		ROOM_INDEX_DATA *pRoomIndex = nullptr;
		MOB_INDEX_DATA *pMobIndex = nullptr;
		OBJ_INDEX_DATA *pObjIndex = nullptr;
		OBJ_INDEX_DATA *pObjToIndex = nullptr;
		OBJ_DATA *secondary = nullptr;
		int count, limit;

		switch (pReset->command)
		{
			case 'M':
				pMobIndex = get_mob_index(pReset->arg1);

				if (pMobIndex == nullptr)
				{
					RS.Logger.Warn("Reset_area: 'M': bad vnum {}.", pReset->arg1);
					continue;
				}

				pRoomIndex = get_room_index(pReset->arg3);

				if (pRoomIndex == nullptr)
				{
					RS.Logger.Warn("Reset_area: 'R': bad vnum {}.", pReset->arg3);
					continue;
				}

				if (pMobIndex->count >= pReset->arg2)
				{
					last= false;
					break;
				}

				count = 0;
				for (mob = pRoomIndex->people; mob != nullptr; mob = mob->next_in_room)
				{
					if (mob->pIndexData == pMobIndex)
					{
						count++;
						if (count >= pReset->arg4)
						{
							last= false;
							break;
						}
					}
				}

				if (count >= pReset->arg4)
					break;

				pMob = create_mobile(pMobIndex);

				/*
				* Some more hard coding.
				*/
				if (room_is_dark(pRoom))
					SET_BIT(pMob->affected_by, AFF_INFRARED);

				/*
				* Pet shop mobiles get ACT_PET set.
				*/
				{
					ROOM_INDEX_DATA *pRoomIndexPrev;

					pRoomIndexPrev = get_room_index(pRoom->vnum - 1);
					if (pRoomIndexPrev && IS_SET(pRoomIndexPrev->room_flags, ROOM_PET_SHOP))
						SET_BIT(pMob->act, ACT_PET);
				}

				pMob->zone = pRoomIndex->area;

				char_to_room(pMob, pRoom);

				LastMob = pMob;
				level = URANGE(0, pMob->level - 2, LEVEL_HERO - 1); /* -1 ROM */
				last = true;
				break;
			case 'O':
				pObjIndex = get_obj_index(pReset->arg1);

				if (!pObjIndex)
				{
					RS.Logger.Warn("Reset_room: 'O' 1 : bad vnum {}", pReset->arg1);
					RS.Logger.Warn("{} {} {} {}", pReset->arg1, pReset->arg2, pReset->arg3, pReset->arg4);
					continue;
				}

				pRoomIndex = get_room_index(pReset->arg3);

				if (!pRoomIndex)
				{
					RS.Logger.Warn("Reset_room: 'O' 2 : bad vnum {}.", pReset->arg3);
					RS.Logger.Warn("{} {} {} {}", pReset->arg1, pReset->arg2, pReset->arg3, pReset->arg4);
					continue;
				}

				for (pObj2 = pRoomIndex->contents; pObj2; pObj2 = pObj2->next_content)
				{
					if (pObj2->pIndexData->vnum == pObjIndex->vnum
						&& !is_obj_stat(pObj2, ITEM_DONATION_PIT)
						&& !is_obj_stat(pObj2, ITEM_CORPSE_PC)
						&& !is_obj_stat(pObj2, ITEM_CORPSE_NPC)
						&& pObj2->item_type == ITEM_CONTAINER
						&& !pObj2->contains)
					{
						extract_obj(pObj2);
					}
				}

				if ((pObjIndex->limcount >= pObjIndex->limtotal && pObjIndex->limtotal > 0)
					|| count_obj_list(pObjIndex, pRoomIndex->contents) > 0)
				{
					last= false;
					break;
				}

				pObj = create_object(pObjIndex, std::min(number_fuzzy(level), LEVEL_HERO - 1));
				pObj->cost = 0;
				pObj->owner = palloc_string("none");
				pObj->talked = palloc_string("someone a long long time ago");

				obj_to_room(pObj, pRoom);

				last = true;
				break;
			case 'P':
				pObjIndex = get_obj_index(pReset->arg1);

				if (!pObjIndex)
				{
					RS.Logger.Warn("Reset_room: 'P': bad vnum {}.", pReset->arg1);
					continue;
				}

				pObjToIndex = get_obj_index(pReset->arg3);

				if (!pObjToIndex)
				{
					RS.Logger.Warn("Reset_room: 'P': bad vnum {}.", pReset->arg3);
					continue;
				}

				if (pReset->arg2 > 50)
					limit = 6;
				else if (pReset->arg2 == -1)
					limit = 999;
				else
					limit = pReset->arg2;

				if (pRoom->area->nplayer > 1
					|| (LastObj = get_obj_type(pObjToIndex)) == nullptr
					|| (LastObj->in_room == nullptr && !last)
					|| (pObjIndex->limtotal > 0 && pObjIndex->limcount >= pObjIndex->limtotal)
					|| (pObjIndex->count >= limit /* && number_range(0,4) != 0 */)
					|| (count = count_obj_list(pObjIndex, LastObj->contains)) > pReset->arg4)
				{
					last= false;
					break;
				}

				while (count < pReset->arg4)
				{
					pObj = create_object(pObjIndex, number_fuzzy(LastObj->level));
					pObj->owner = palloc_string("none");
					obj_to_obj(pObj, LastObj);

					count++;

					if (pObjIndex->limcount >= pObjIndex->limtotal && pObjIndex->limtotal > 0)
						break;
				}

				LastObj->value[1] = LastObj->pIndexData->value[1];
				last = true;
				break;
			case 'G':
			case 'E':
				pObjIndex = get_obj_index(pReset->arg1);

				if (!pObjIndex)
				{
					RS.Logger.Warn("Reset_room: 'E' or 'G': bad vnum {}.", pReset->arg1);
					continue;
				}

				if (!last)
					break;

				if (!LastMob)
				{
					RS.Logger.Warn("Reset_room: 'E' or 'G': null mob for vnum {}.", pReset->arg1);
					last= false;
					break;
				}

				if (LastMob->pIndexData->pShop)
				{
					int olevel = 0, i, j;

					if (!pObjIndex->new_format)
					{
						switch (pObjIndex->item_type)
						{
							case ITEM_PILL:
							case ITEM_POTION:
							case ITEM_SCROLL:
								olevel = 53;
								for (i = 1; i < 5; i++)
								{
									if (pObjIndex->value[i] > 0)
									{
										for (j = 0; j < MAX_CLASS; j++)
										{
											olevel = std::min(olevel, (int)skill_table[pObjIndex->value[i]].skill_level[j]);
										}
									}
								}
								olevel = std::max(0, (olevel * 3 / 4) - 2);
								break;
							case ITEM_WAND:
								olevel = number_range(10, 20);
								break;
							case ITEM_STAFF:
								olevel = number_range(15, 25);
								break;
							case ITEM_ARMOR:
								olevel = number_range(5, 15);
								break;
							case ITEM_WEAPON:
								olevel = number_range(5, 15);
								break;
							case ITEM_TREASURE:
								olevel = number_range(10, 20);
								break;
							default:
								olevel = 0;
								break;
						}
					}

					pObj = create_object(pObjIndex, olevel);
					pObj->owner = palloc_string("none");

					if (pObj->pIndexData->limtotal == 0)
						SET_BIT(pObj->extra_flags, ITEM_INVENTORY);
				}
				else /* ROM OLC else version */
				{
					int limit;

					if (pReset->arg2 > 50) /* old format */
						limit = 6;
					else if (pReset->arg2 == -1 || pReset->arg2 == 0) /* no limit */
						limit = 999;
					else
						limit = pReset->arg2;

					if (pObjIndex->limcount >= pObjIndex->limtotal && pObjIndex->limtotal > 0)
					{
						break;
					}
					else
					{
						pObj = create_object(pObjIndex, std::min(number_fuzzy(level), LEVEL_HERO - 1));
					}

					pObj->owner = palloc_string("none");
				}

				obj_to_char(pObj, LastMob);

				if (pReset->command == 'E')
				{
					if (pReset->arg3 == 16)
					{
						secondary = get_eq_char(LastMob, WEAR_WIELD);

						if (secondary != nullptr)
						{
							unequip_char(LastMob, secondary, true);
							equip_char(LastMob, secondary, 18, true);
							equip_char(LastMob, pObj, 16, true);
						}
						else
						{
							equip_char(LastMob, pObj, pReset->arg3, true);
						}
					}
					else if (pReset->arg3 == 18)
					{
						if (get_eq_char(LastMob, WEAR_WIELD) == nullptr)
							equip_char(LastMob, pObj, 16, true);
						else
							equip_char(LastMob, pObj, pReset->arg3, true);
					}
					else
					{
						equip_char(LastMob, pObj, pReset->arg3, true);
					}
				}
				last = true;
				break;

			case 'F':
				found= false;

				if (!LastMob)
					continue;

				for (rch = LastMob->in_room->people; rch != nullptr; rch = rch->next_in_room)
				{
					if (is_npc(rch) && (pReset->arg2 == rch->pIndexData->vnum))
					{
						found = true;
						break;
					}
				}

				if (!last || !found)
					break;

				add_follower(LastMob, rch);
				LastMob->leader = rch;
				break;
			case 'D':
				pRoomIndex = get_room_index(pReset->arg1);

				if (pRoomIndex == nullptr)
				{
					RS.Logger.Warn("Reset_area: 'D': bad vnum {}.", pReset->arg1);
					continue;
				}

				pexit = pRoomIndex->exit[pReset->arg2];

				if (pexit == nullptr)
					break;

				SET_BIT(pexit->exit_info, EX_ISDOOR);

				switch (pReset->arg3)
				{
					case 0:
						REMOVE_BIT(pexit->exit_info, EX_CLOSED);
						REMOVE_BIT(pexit->exit_info, EX_LOCKED);
						break;
					case 1:
						SET_BIT(pexit->exit_info, EX_CLOSED);
						REMOVE_BIT(pexit->exit_info, EX_LOCKED);
						break;
					case 2:
						SET_BIT(pexit->exit_info, EX_CLOSED);
						SET_BIT(pexit->exit_info, EX_LOCKED);
						break;
				}

				last = true;
				break;
			case 'R':
				pRoomIndex = get_room_index(pReset->arg1);

				if (!pRoomIndex)
				{
					RS.Logger.Warn("Reset_room: 'R': bad vnum {}.", pReset->arg1);
					continue;
				}

				{
					EXIT_DATA *pExit;
					int d0;
					int d1;

					for (d0 = 0; d0 < pReset->arg2 - 1; d0++)
					{
						d1 = number_range(d0, pReset->arg2 - 1);
						pExit = pRoomIndex->exit[d0];
						pRoomIndex->exit[d0] = pRoomIndex->exit[d1];
						pRoomIndex->exit[d1] = pExit;
					}
				}

				break;
			default:
				RS.Logger.Warn("Reset_area: bad command {}.", pReset->command);
				break;
		}
	}
}